

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O1

void __thiscall deqp::egl::MakeCurrentPerfCase::createPBuffer(MakeCurrentPerfCase *this)

{
  pointer *pppvVar1;
  iterator __position;
  int iVar2;
  deUint32 err;
  Library *pLVar3;
  undefined4 extraout_var;
  EGLSurface surface;
  EGLint attribList [5];
  void *local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  
  pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_28 = 0x3057;
  uStack_24 = 0x100;
  uStack_20 = 0x3056;
  uStack_1c = 0x100;
  local_18 = 0x3038;
  iVar2 = (*pLVar3->_vptr_Library[10])(pLVar3,this->m_display,this->m_config);
  local_30 = (void *)CONCAT44(extraout_var,iVar2);
  err = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
  eglu::checkError(err,"eglCreatePbufferSurface()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                   ,0x10b);
  __position._M_current =
       (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&this->m_surfaces,__position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    pppvVar1 = &(this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::createPBuffer (void)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	const EGLint	width	= 256;
	const EGLint	height	= 256;

	const EGLint attribList[] = {
		EGL_WIDTH,	width,
		EGL_HEIGHT, height,
		EGL_NONE
	};

	EGLSurface	surface = egl.createPbufferSurface(m_display, m_config, attribList);

	EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface()");

	m_surfaces.push_back(surface);
}